

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O2

string * __thiscall verilogAST::If::toString_abi_cxx11_(string *__return_storage_ptr__,If *this)

{
  pointer puVar1;
  If *pIVar2;
  pointer ppVar3;
  pointer puVar4;
  string local_100;
  If *local_e0;
  pointer local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_100);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  (**(((this->cond)._M_t.
       super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
       _M_t.
       super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)._vptr_Node
  )(&local_100);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  puVar1 = (this->true_body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->true_body).
                super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*(code *)**(undefined8 **)
                (puVar4->_M_t).
                super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
              (&local_50);
    add_tab(&local_100,&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ppVar3 = (this->else_ifs).
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (this->else_ifs).
             super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::vector<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = this;
  while( true ) {
    pIVar2 = local_e0;
    if (ppVar3 == local_d8) break;
    (**(_func_int **)
       ((ppVar3->first)._M_t.
        super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>.
        _M_t.
        super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
        .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
              (&local_d0);
    std::operator+(&local_b0," else if (",&local_d0);
    std::operator+(&local_100,&local_b0,") begin\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    puVar1 = (ppVar3->second).
             super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (ppVar3->second).
                  super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      (*(code *)**(undefined8 **)
                  (puVar4->_M_t).
                  super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                  .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                (&local_70);
      add_tab(&local_100,&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ppVar3 = ppVar3 + 1;
  }
  if ((local_e0->else_body).
      super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_e0->else_body).
      super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar1 = (pIVar2->else_body).
             super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (pIVar2->else_body).
                  super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      (*(code *)**(undefined8 **)
                  (puVar4->_M_t).
                  super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                  .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                (&local_90);
      add_tab(&local_100,&local_90);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string If::toString() {
  std::string if_str = "";
  if_str += "if (";
  if_str += this->cond->toString();
  if_str += ") begin\n";

  for (auto &statement : this->true_body) {
    if_str += add_tab(statement->toString());
  }

  if_str += "end";

  for (auto &entry : this->else_ifs) {
    if_str += " else if (" + entry.first->toString() + ") begin\n";
    for (auto &statement : entry.second) {
      if_str += add_tab(statement->toString());
    }
    if_str += "end";
  }

  if (this->else_body.size()) {
    if_str += " else begin\n";
    for (auto &statement : else_body) {
      if_str += add_tab(statement->toString());
    }
    if_str += "end";
  }
  return if_str;
}